

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostDetailsProvider.cpp
# Opt level: O0

bool __thiscall
FIX::HostDetailsProvider::populateHostDetails
          (HostDetailsProvider *this,int n,Dictionary *d,HostDetails *out)

{
  bool bVar1;
  int iVar2;
  string local_140;
  string local_120;
  undefined1 local_100 [8];
  string suffix;
  undefined1 local_d8 [8];
  string sourcePort;
  undefined1 local_b0 [8];
  string sourceHost;
  undefined1 local_88 [8];
  string port;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string host;
  HostDetails *out_local;
  Dictionary *d_local;
  int n_local;
  HostDetailsProvider *this_local;
  
  host.field_2._8_8_ = out;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"SocketConnectHost",&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"SocketConnectPort",
             (allocator<char> *)(sourceHost.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(sourceHost.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"SocketConnectSourceHost",
             (allocator<char> *)(sourcePort.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(sourcePort.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"SocketConnectSourcePort",
             (allocator<char> *)(suffix.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(suffix.field_2._M_local_buf + 0xf));
  if (0 < n) {
    std::__cxx11::to_string((string *)local_100,n);
    std::__cxx11::string::operator+=((string *)local_50,(string *)local_100);
    std::__cxx11::string::operator+=((string *)local_88,(string *)local_100);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)local_100);
    std::__cxx11::string::operator+=((string *)local_d8,(string *)local_100);
    std::__cxx11::string::~string((string *)local_100);
  }
  bVar1 = Dictionary::has(d,(string *)local_50);
  if ((bVar1) && (bVar1 = Dictionary::has(d,(string *)local_88), bVar1)) {
    Dictionary::getString(&local_120,d,(string *)local_50,false);
    std::__cxx11::string::operator=((string *)host.field_2._8_8_,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    iVar2 = Dictionary::getInt(d,(string *)local_88);
    *(short *)(host.field_2._8_8_ + 0x20) = (short)iVar2;
    bVar1 = Dictionary::has(d,(string *)local_b0);
    if (bVar1) {
      Dictionary::getString(&local_140,d,(string *)local_b0,false);
      std::__cxx11::string::operator=((string *)(host.field_2._8_8_ + 0x28),(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
    }
    bVar1 = Dictionary::has(d,(string *)local_d8);
    if (bVar1) {
      iVar2 = Dictionary::getInt(d,(string *)local_d8);
      *(short *)(host.field_2._8_8_ + 0x48) = (short)iVar2;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool FIX::HostDetailsProvider::populateHostDetails(int n, const Dictionary &d, HostDetails &out) {
  std::string host = SOCKET_CONNECT_HOST;
  std::string port = SOCKET_CONNECT_PORT;
  std::string sourceHost = SOCKET_CONNECT_SOURCE_HOST;
  std::string sourcePort = SOCKET_CONNECT_SOURCE_PORT;

  if (n > 0) {
    std::string suffix = std::to_string(n);
    host += suffix;
    port += suffix;
    sourceHost += suffix;
    sourcePort += suffix;
  }

  if (d.has(host) && d.has(port)) {
    out.address = d.getString(host);
    out.port = (short)d.getInt(port);

    if (d.has(sourceHost)) {
      out.sourceAddress = d.getString(sourceHost);
    }

    if (d.has(sourcePort)) {
      out.sourcePort = (short)d.getInt(sourcePort);
    }

    return true;
  }
  return false;
}